

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  BYTE *pBVar9;
  seqDef *psVar10;
  U32 UVar11;
  uint uVar12;
  BYTE *pBVar13;
  BYTE *mEnd;
  uint uVar14;
  int iVar15;
  int *ip;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  int *ip_00;
  U32 UVar21;
  ulong uVar22;
  BYTE *litEnd;
  ulong uVar23;
  long lVar24;
  size_t ofbCandidate;
  uint local_100;
  uint local_fc;
  int *local_f8;
  ulong local_f0;
  uint local_e4;
  BYTE *local_e0;
  ulong local_d8;
  uint local_cc;
  BYTE *local_c8;
  int local_bc;
  BYTE *litLimit_w;
  BYTE *local_b0;
  seqStore_t *local_a8;
  int *local_a0;
  BYTE *local_98;
  U32 maxDistance;
  uint local_84;
  BYTE *local_80;
  int *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  U32 *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  local_e0 = (ms->window).base;
  local_c8 = (ms->window).dictBase;
  uVar16 = (ms->window).dictLimit;
  local_d8 = (ulong)uVar16;
  uVar17 = (ms->window).lowLimit;
  uVar12 = (ms->cParams).windowLog;
  local_e4 = (ms->cParams).minMatch;
  if (5 < local_e4) {
    local_e4 = 6;
  }
  if (local_e4 < 5) {
    local_e4 = 4;
  }
  local_cc = (ms->cParams).searchLog;
  local_fc = 6;
  if (local_cc < 6) {
    local_fc = local_cc;
  }
  if (local_fc < 5) {
    local_fc = 4;
  }
  local_f0 = (ulong)*rep;
  uVar7 = rep[1];
  ms->lazySkipping = 0;
  local_b0 = local_e0 + local_d8;
  local_a0 = (int *)((long)src + (srcSize - 0x10));
  uVar2 = ms->nextToUpdate;
  uVar18 = (ulong)uVar2;
  uVar14 = ((int)local_a0 - (int)(local_e0 + uVar18)) + 1;
  if (7 < uVar14) {
    uVar14 = 8;
  }
  uVar3 = 0;
  if (local_e0 + uVar18 <= local_a0) {
    uVar3 = uVar14;
  }
  cVar4 = (char)ms->rowHashLog;
  iEnd = (BYTE *)((long)src + srcSize);
  for (; uVar18 < uVar3 + uVar2; uVar18 = uVar18 + 1) {
    if (local_e4 == 5) {
      uVar22 = *(long *)(local_e0 + uVar18) * -0x30e4432345000000;
LAB_01bc6410:
      UVar21 = (U32)((uVar22 ^ ms->hashSalt) >> (0x38U - cVar4 & 0x3f));
    }
    else {
      if (local_e4 == 6) {
        uVar22 = *(long *)(local_e0 + uVar18) * -0x30e4432340650000;
        goto LAB_01bc6410;
      }
      UVar21 = (*(int *)(local_e0 + uVar18) * -0x61c8864f ^ (uint)ms->hashSalt) >>
               (0x18U - cVar4 & 0x1f);
    }
    ms->hashCache[(uint)uVar18 & 7] = UVar21;
  }
  local_98 = local_c8 + local_d8;
  local_80 = local_c8 + uVar17;
  uVar17 = 1 << ((byte)uVar12 & 0x1f);
  _maxDistance = (ulong)uVar17;
  ip = (int *)((ulong)(local_b0 == (BYTE *)src) + (long)src);
  litLimit_w = iEnd + -0x20;
  iVar6 = (int)local_e0;
  local_68 = (ulong)((1 - uVar17) - iVar6);
  local_60 = (ulong)(1 - iVar6);
  local_bc = uVar16 - 1;
  local_70 = (ulong)((uVar16 + iVar6) - 2);
  pBVar9 = local_e0;
  local_a8 = seqStore;
  local_58 = rep;
  uVar16 = local_e4;
LAB_01bc650f:
  do {
    local_100 = uVar7;
    if (local_a0 <= ip) {
      *local_58 = (uint)local_f0;
      local_58[1] = local_100;
      return (long)iEnd - (long)src;
    }
    iVar15 = (int)ip;
    iVar6 = (iVar15 - (int)pBVar9) + 1;
    UVar21 = (ms->window).lowLimit;
    UVar11 = iVar6 - (uint)_maxDistance;
    if (iVar6 - UVar21 <= (uint)_maxDistance) {
      UVar11 = UVar21;
    }
    if (ms->loadedDictEnd != 0) {
      UVar11 = UVar21;
    }
    uVar17 = iVar6 - (uint)local_f0;
    pBVar13 = local_c8;
    if ((uint)local_d8 <= uVar17) {
      pBVar13 = pBVar9;
    }
    local_f8 = (int *)((long)ip + 1);
    if (local_bc - uVar17 < 3) {
LAB_01bc65b9:
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      if ((uint)local_f0 <= iVar6 - UVar11) {
        if (*local_f8 != *(int *)(pBVar13 + uVar17)) goto LAB_01bc65b9;
        pBVar9 = local_98;
        if ((uint)local_d8 <= uVar17) {
          pBVar9 = iEnd;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar13 + uVar17) + 4),iEnd,pBVar9
                           ,local_b0);
        uVar18 = sVar8 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (uVar16 == 6) {
      if (local_fc == 6) {
        uVar22 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else if (local_fc == 5) {
        uVar22 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else {
        uVar22 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
    }
    else if (uVar16 == 5) {
      if (local_fc == 6) {
        uVar22 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else if (local_fc == 5) {
        uVar22 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else {
        uVar22 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
    }
    else if (local_fc == 6) {
      uVar22 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
    }
    else if (local_fc == 5) {
      uVar22 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
    }
    else {
      uVar22 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
    }
    uVar23 = uVar18;
    if (uVar18 < uVar22) {
      uVar23 = uVar22;
    }
    if (uVar23 < 4) {
      uVar18 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar18 >> 8) + 1);
      ms->lazySkipping = (uint)(0x8ff < uVar18);
      pBVar9 = local_e0;
      uVar7 = local_100;
      goto LAB_01bc650f;
    }
    uVar19 = 1;
    if (uVar18 < uVar22) {
      local_f8 = ip;
      uVar19 = ofbCandidate;
    }
    local_40 = (ulong)(uint)((int)local_68 + iVar15);
    local_48 = (ulong)(uint)((int)local_60 + iVar15);
    uVar17 = ((int)local_70 + (int)local_f0) - iVar15;
    local_50 = (ulong)(uint)(((int)local_60 - (int)local_f0) + iVar15);
    piVar20 = ip;
    for (lVar24 = 0; (int *)((long)ip + lVar24) < local_a0; lVar24 = lVar24 + 1) {
      ip_00 = (int *)((long)ip + lVar24 + 1);
      local_84 = uVar17;
      local_38 = piVar20;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        UVar21 = (ms->window).lowLimit;
        iVar15 = (int)lVar24;
        iVar6 = (int)local_48 + iVar15;
        UVar11 = (int)local_40 + iVar15;
        if (iVar6 - UVar21 <= maxDistance) {
          UVar11 = UVar21;
        }
        if (ms->loadedDictEnd != 0) {
          UVar11 = UVar21;
        }
        uVar12 = (int)local_50 + iVar15;
        pBVar9 = local_e0;
        if (uVar12 < (uint)local_d8) {
          pBVar9 = local_c8;
        }
        if (((2 < uVar17) && ((uint)local_f0 <= iVar6 - UVar11)) &&
           (*ip_00 == *(int *)(pBVar9 + uVar12))) {
          pBVar13 = iEnd;
          if (uVar12 < (uint)local_d8) {
            pBVar13 = local_98;
          }
          local_78 = ip_00;
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)ip + lVar24 + 5),(BYTE *)((long)(pBVar9 + uVar12) + 4),
                             iEnd,pBVar13,local_b0);
          ip_00 = local_78;
          uVar16 = local_e4;
          if (sVar8 < 0xfffffffffffffffc) {
            uVar17 = 0x1f;
            if ((uint)uVar19 != 0) {
              for (; (uint)uVar19 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            if ((int)((uVar17 ^ 0x1f) + (int)uVar23 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
              local_f8 = local_78;
              uVar19 = 1;
              uVar23 = sVar8 + 4;
            }
          }
        }
      }
      ofbCandidate = 999999999;
      if (uVar16 == 6) {
        if (local_fc == 6) {
          uVar18 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else if (local_fc == 5) {
          uVar18 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
      }
      else if (uVar16 == 5) {
        if (local_fc == 6) {
          uVar18 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else if (local_fc == 5) {
          uVar18 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
      }
      else if (local_fc == 6) {
        uVar18 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else if (local_fc == 5) {
        uVar18 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else {
        uVar18 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      uVar16 = local_e4;
      if (uVar18 < 4) break;
      uVar17 = 0x1f;
      if ((uint)uVar19 != 0) {
        for (; (uint)uVar19 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      iVar6 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      if ((int)uVar18 * 4 - iVar6 <= (int)((uVar17 ^ 0x1f) + (int)uVar23 * 4 + -0x1b)) break;
      piVar20 = (int *)((long)local_38 + 1);
      uVar17 = local_84 - 1;
      uVar19 = ofbCandidate;
      uVar23 = uVar18;
      local_f8 = piVar20;
    }
    if (3 < uVar19) {
      uVar18 = (long)local_f8 + (-(long)local_e0 - uVar19) + 3;
      pBVar13 = local_b0;
      pBVar9 = local_e0;
      if ((uint)uVar18 < (uint)local_d8) {
        pBVar13 = local_80;
        pBVar9 = local_c8;
      }
      pBVar9 = pBVar9 + (uVar18 & 0xffffffff);
      for (; ((src < local_f8 && (pBVar13 < pBVar9)) &&
             (*(BYTE *)((long)local_f8 + -1) == pBVar9[-1]));
          local_f8 = (int *)((long)local_f8 + -1)) {
        pBVar9 = pBVar9 + -1;
        uVar23 = uVar23 + 1;
      }
      local_100 = (uint)local_f0;
      local_f0 = (ulong)((U32)uVar19 - 3);
    }
    uVar18 = (long)local_f8 - (long)src;
    pBVar9 = local_a8->lit;
    if (litLimit_w < local_f8) {
      ZSTD_safecopyLiterals(pBVar9,(BYTE *)src,(BYTE *)local_f8,litLimit_w);
LAB_01bc6a49:
      local_a8->lit = local_a8->lit + uVar18;
      psVar10 = local_a8->sequences;
      if (0xffff < uVar18) {
        local_a8->longLengthType = ZSTD_llt_literalLength;
        local_a8->longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)local_a8->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar9 = *src;
      *(undefined8 *)(pBVar9 + 8) = uVar5;
      pBVar9 = local_a8->lit;
      if (0x10 < uVar18) {
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar9 + 0x18) = uVar5;
        if (0x20 < (long)uVar18) {
          lVar24 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar24 + 0x20);
            uVar5 = puVar1[1];
            pBVar13 = pBVar9 + lVar24 + 0x20;
            *(undefined8 *)pBVar13 = *puVar1;
            *(undefined8 *)(pBVar13 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar24 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar13 + 0x18) = uVar5;
            lVar24 = lVar24 + 0x20;
          } while (pBVar13 + 0x20 < pBVar9 + uVar18);
        }
        goto LAB_01bc6a49;
      }
      local_a8->lit = pBVar9 + uVar18;
      psVar10 = local_a8->sequences;
    }
    pBVar9 = local_e0;
    psVar10->litLength = (U16)uVar18;
    psVar10->offBase = (U32)uVar19;
    if (0xffff < uVar23 - 3) {
      local_a8->longLengthType = ZSTD_llt_matchLength;
      local_a8->longLengthPos = (U32)((ulong)((long)psVar10 - (long)local_a8->sequencesStart) >> 3);
    }
    psVar10->mlBase = (U16)(uVar23 - 3);
    local_a8->sequences = psVar10 + 1;
    if (ms->lazySkipping != 0) {
      uVar17 = ms->nextToUpdate;
      uVar18 = (ulong)uVar17;
      uVar12 = ((int)local_a0 - (int)(local_e0 + uVar18)) + 1;
      if (7 < uVar12) {
        uVar12 = 8;
      }
      if (local_a0 < local_e0 + uVar18) {
        uVar12 = 0;
      }
      cVar4 = (char)ms->rowHashLog;
      for (; uVar18 < uVar12 + uVar17; uVar18 = uVar18 + 1) {
        if (uVar16 == 5) {
          uVar22 = *(long *)(local_e0 + uVar18) * -0x30e4432345000000;
LAB_01bc6bb8:
          UVar21 = (U32)((uVar22 ^ ms->hashSalt) >> (0x38U - cVar4 & 0x3f));
        }
        else {
          if (uVar16 == 6) {
            uVar22 = *(long *)(local_e0 + uVar18) * -0x30e4432340650000;
            goto LAB_01bc6bb8;
          }
          UVar21 = (*(int *)(local_e0 + uVar18) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                   (0x18U - cVar4 & 0x1f);
        }
        ms->hashCache[(uint)uVar18 & 7] = UVar21;
      }
      ms->lazySkipping = 0;
    }
    uVar7 = local_100;
    for (ip = (int *)((long)local_f8 + uVar23); uVar18 = (ulong)uVar7, src = ip, ip <= local_a0;
        ip = (int *)((long)ip + sVar8 + 4)) {
      iVar6 = (int)ip - (int)pBVar9;
      UVar21 = (ms->window).lowLimit;
      UVar11 = iVar6 - (uint)_maxDistance;
      if (iVar6 - UVar21 <= (uint)_maxDistance) {
        UVar11 = UVar21;
      }
      if (ms->loadedDictEnd != 0) {
        UVar11 = UVar21;
      }
      uVar17 = iVar6 - uVar7;
      pBVar13 = pBVar9;
      if (uVar17 < (uint)local_d8) {
        pBVar13 = local_c8;
      }
      if (((local_bc - uVar17 < 3) || (iVar6 - UVar11 < uVar7)) ||
         (*ip != *(int *)(pBVar13 + uVar17))) break;
      mEnd = iEnd;
      if (uVar17 < (uint)local_d8) {
        mEnd = local_98;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar13 + uVar17) + 4),iEnd,mEnd,local_b0)
      ;
      pBVar13 = local_a8->lit;
      if (litLimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar13,(BYTE *)ip,(BYTE *)ip,litLimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar13 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar13 + 8) = uVar5;
      }
      psVar10 = local_a8->sequences;
      psVar10->litLength = 0;
      psVar10->offBase = 1;
      if (0xffff < sVar8 + 1) {
        local_a8->longLengthType = ZSTD_llt_matchLength;
        local_a8->longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)local_a8->sequencesStart) >> 3);
      }
      psVar10->mlBase = (U16)(sVar8 + 1);
      local_a8->sequences = psVar10 + 1;
      uVar7 = (uint)local_f0;
      local_f0 = uVar18;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1);
}